

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O0

int ARKStepSetDefaults(void *arkode_mem)

{
  int retval;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  uint in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  void *in_stack_ffffffffffffffe8;
  int local_4;
  
  local_4 = arkStep_AccessStepMem
                      (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                       (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       (ARKodeARKStepMem *)0x1124194);
  if (local_4 == 0) {
    local_4 = arkSetDefaults((void *)(ulong)in_stack_ffffffffffffffd8);
    if (local_4 == 0) {
      in_stack_ffffffffffffffe0[0x50] = '\x04';
      in_stack_ffffffffffffffe0[0x51] = '\0';
      in_stack_ffffffffffffffe0[0x52] = '\0';
      in_stack_ffffffffffffffe0[0x53] = '\0';
      in_stack_ffffffffffffffe0[0x54] = '\0';
      in_stack_ffffffffffffffe0[0x55] = '\0';
      in_stack_ffffffffffffffe0[0x56] = '\0';
      in_stack_ffffffffffffffe0[0x57] = '\0';
      in_stack_ffffffffffffffe0[0xb0] = '\0';
      in_stack_ffffffffffffffe0[0xb1] = '\0';
      in_stack_ffffffffffffffe0[0xb2] = '\0';
      in_stack_ffffffffffffffe0[0xb3] = '\0';
      in_stack_ffffffffffffffe0[0x10] = '\0';
      in_stack_ffffffffffffffe0[0x11] = '\0';
      in_stack_ffffffffffffffe0[0x12] = '\0';
      in_stack_ffffffffffffffe0[0x13] = '\0';
      in_stack_ffffffffffffffe0[0x14] = '\x01';
      in_stack_ffffffffffffffe0[0x15] = '\0';
      in_stack_ffffffffffffffe0[0x16] = '\0';
      in_stack_ffffffffffffffe0[0x17] = '\0';
      in_stack_ffffffffffffffe0[0x18] = '\x01';
      in_stack_ffffffffffffffe0[0x19] = '\0';
      in_stack_ffffffffffffffe0[0x1a] = '\0';
      in_stack_ffffffffffffffe0[0x1b] = '\0';
      in_stack_ffffffffffffffe0[0x1c] = '\x01';
      in_stack_ffffffffffffffe0[0x1d] = '\0';
      in_stack_ffffffffffffffe0[0x1e] = '\0';
      in_stack_ffffffffffffffe0[0x1f] = '\0';
      in_stack_ffffffffffffffe0[0x20] = '\0';
      in_stack_ffffffffffffffe0[0x21] = '\0';
      in_stack_ffffffffffffffe0[0x22] = '\0';
      in_stack_ffffffffffffffe0[0x23] = '\0';
      in_stack_ffffffffffffffe0[0xf8] = '\x03';
      in_stack_ffffffffffffffe0[0xf9] = '\0';
      in_stack_ffffffffffffffe0[0xfa] = '\0';
      in_stack_ffffffffffffffe0[0xfb] = '\0';
      *(undefined1 **)(in_stack_ffffffffffffffe0 + 0xe0) = &DAT_3fb999999999999a;
      in_stack_ffffffffffffffe0[0xb8] = '3';
      in_stack_ffffffffffffffe0[0xb9] = '3';
      in_stack_ffffffffffffffe0[0xba] = '3';
      in_stack_ffffffffffffffe0[0xbb] = '3';
      in_stack_ffffffffffffffe0[0xbc] = '3';
      in_stack_ffffffffffffffe0[0xbd] = '3';
      in_stack_ffffffffffffffe0[0xbe] = -0x2d;
      in_stack_ffffffffffffffe0[0xbf] = '?';
      in_stack_ffffffffffffffe0[0xc0] = 'f';
      in_stack_ffffffffffffffe0[0xc1] = 'f';
      in_stack_ffffffffffffffe0[0xc2] = 'f';
      in_stack_ffffffffffffffe0[0xc3] = 'f';
      in_stack_ffffffffffffffe0[0xc4] = 'f';
      in_stack_ffffffffffffffe0[0xc5] = 'f';
      in_stack_ffffffffffffffe0[0xc6] = '\x02';
      in_stack_ffffffffffffffe0[199] = '@';
      in_stack_ffffffffffffffe0[0xa8] = -0x66;
      in_stack_ffffffffffffffe0[0xa9] = -0x67;
      in_stack_ffffffffffffffe0[0xaa] = -0x67;
      in_stack_ffffffffffffffe0[0xab] = -0x67;
      in_stack_ffffffffffffffe0[0xac] = -0x67;
      in_stack_ffffffffffffffe0[0xad] = -0x67;
      in_stack_ffffffffffffffe0[0xae] = -0x37;
      in_stack_ffffffffffffffe0[0xaf] = '?';
      in_stack_ffffffffffffffe0[0xe8] = '\x14';
      in_stack_ffffffffffffffe0[0xe9] = '\0';
      in_stack_ffffffffffffffe0[0xea] = '\0';
      in_stack_ffffffffffffffe0[0xeb] = '\0';
      in_stack_ffffffffffffffe0[0x5c] = '\0';
      in_stack_ffffffffffffffe0[0x5d] = '\0';
      in_stack_ffffffffffffffe0[0x5e] = '\0';
      in_stack_ffffffffffffffe0[0x5f] = '\0';
      in_stack_ffffffffffffffe0[0x58] = '\0';
      in_stack_ffffffffffffffe0[0x59] = '\0';
      in_stack_ffffffffffffffe0[0x5a] = '\0';
      in_stack_ffffffffffffffe0[0x5b] = '\0';
      in_stack_ffffffffffffffe0[0x60] = '\0';
      in_stack_ffffffffffffffe0[0x61] = '\0';
      in_stack_ffffffffffffffe0[0x62] = '\0';
      in_stack_ffffffffffffffe0[99] = '\0';
      in_stack_ffffffffffffffe0[100] = '\0';
      in_stack_ffffffffffffffe0[0x65] = '\0';
      in_stack_ffffffffffffffe0[0x66] = '\0';
      in_stack_ffffffffffffffe0[0x67] = '\0';
      in_stack_ffffffffffffffe0[0x68] = '\0';
      in_stack_ffffffffffffffe0[0x69] = '\0';
      in_stack_ffffffffffffffe0[0x6a] = '\0';
      in_stack_ffffffffffffffe0[0x6b] = '\0';
      in_stack_ffffffffffffffe0[0x6c] = '\0';
      in_stack_ffffffffffffffe0[0x6d] = '\0';
      in_stack_ffffffffffffffe0[0x6e] = '\0';
      in_stack_ffffffffffffffe0[0x6f] = '\0';
      in_stack_ffffffffffffffe0[0x78] = '\0';
      in_stack_ffffffffffffffe0[0x79] = '\0';
      in_stack_ffffffffffffffe0[0x7a] = '\0';
      in_stack_ffffffffffffffe0[0x7b] = '\0';
      in_stack_ffffffffffffffe0[0x7c] = '\0';
      in_stack_ffffffffffffffe0[0x7d] = '\0';
      in_stack_ffffffffffffffe0[0x7e] = '\0';
      in_stack_ffffffffffffffe0[0x7f] = '\0';
      in_stack_ffffffffffffffe0[0x100] = '\0';
      in_stack_ffffffffffffffe0[0x101] = '\0';
      in_stack_ffffffffffffffe0[0x102] = '\0';
      in_stack_ffffffffffffffe0[0x103] = '\0';
      in_stack_ffffffffffffffe0[0xfc] = '\0';
      in_stack_ffffffffffffffe0[0xfd] = '\0';
      in_stack_ffffffffffffffe0[0xfe] = '\0';
      in_stack_ffffffffffffffe0[0xff] = '\0';
      in_stack_ffffffffffffffe0[0x70] = '\0';
      in_stack_ffffffffffffffe0[0x71] = '\0';
      in_stack_ffffffffffffffe0[0x72] = '\0';
      in_stack_ffffffffffffffe0[0x73] = '\0';
      in_stack_ffffffffffffffe0[0x74] = '\0';
      in_stack_ffffffffffffffe0[0x75] = '\0';
      in_stack_ffffffffffffffe0[0x76] = '\0';
      in_stack_ffffffffffffffe0[0x77] = '\0';
      local_4 = 0;
    }
    else {
      arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::ARKStep","ARKStepSetDefaults",
                      "Error setting ARKode infrastructure defaults");
    }
  }
  return local_4;
}

Assistant:

int ARKStepSetDefaults(void* arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepSetDefaults",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* Set default ARKode infrastructure parameters */
  retval = arkSetDefaults(ark_mem);
  if (retval != ARK_SUCCESS) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::ARKStep",
                    "ARKStepSetDefaults",
                    "Error setting ARKode infrastructure defaults");
    return(retval);
  }

  /* Set default values for integrator optional inputs */
  step_mem->q                = Q_DEFAULT;      /* method order */
  step_mem->p                = 0;              /* embedding order */
  step_mem->predictor        = 0;              /* trivial predictor */
  step_mem->linear           = SUNFALSE;       /* nonlinear problem */
  step_mem->linear_timedep   = SUNTRUE;        /* dfi/dy depends on t */
  step_mem->explicit         = SUNTRUE;        /* fe(t,y) will be used */
  step_mem->implicit         = SUNTRUE;        /* fi(t,y) will be used */
  step_mem->deduce_rhs       = SUNFALSE;       /* deduce fi on result of NLS */
  step_mem->maxcor           = MAXCOR;         /* max nonlinear iters/stage */
  step_mem->nlscoef          = NLSCOEF;        /* nonlinear tolerance coefficient */
  step_mem->crdown           = CRDOWN;         /* nonlinear convergence estimate coeff. */
  step_mem->rdiv             = RDIV;           /* nonlinear divergence tolerance */
  step_mem->dgmax            = DGMAX;          /* max step change before recomputing J or P */
  step_mem->msbp             = MSBP;           /* max steps between updates to J or P */
  step_mem->stages           = 0;              /* no stages */
  step_mem->istage           = 0;              /* current stage */
  step_mem->Be               = NULL;           /* no Butcher tables */
  step_mem->Bi               = NULL;
  step_mem->NLS              = NULL;           /* no nonlinear solver object */
  step_mem->jcur             = SUNFALSE;
  step_mem->convfail         = ARK_NO_FAILURES;
  step_mem->stage_predict    = NULL;           /* no user-supplied stage predictor */
  return(ARK_SUCCESS);
}